

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

char * __thiscall cmCTestTestHandler::GetTestStatus(cmCTestTestHandler *this,int status)

{
  char (*pacVar1) [100];
  
  pacVar1 = (char (*) [100])"No Status";
  if ((uint)status < 10) {
    pacVar1 = GetTestStatus::statuses + (uint)status;
  }
  return *pacVar1;
}

Assistant:

const char* cmCTestTestHandler::GetTestStatus(int status)
{
  static const char statuses[][100] = {
    "Not Run",
    "Timeout",
    "SEGFAULT",
    "ILLEGAL",
    "INTERRUPT",
    "NUMERICAL",
    "OTHER_FAULT",
    "Failed",
    "BAD_COMMAND",
    "Completed"
  };

  if ( status < cmCTestTestHandler::NOT_RUN ||
       status > cmCTestTestHandler::COMPLETED )
    {
    return "No Status";
    }
  return statuses[status];
}